

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Demangle.cpp
# Opt level: O0

bool WTF::ParseName(State *state)

{
  bool bVar1;
  undefined1 local_48 [8];
  State copy;
  State *state_local;
  
  copy._40_8_ = state;
  bVar1 = ParseNestedName(state);
  if ((bVar1) || (bVar1 = ParseLocalName((State *)copy._40_8_), bVar1)) {
    state_local._7_1_ = true;
  }
  else {
    memcpy(local_48,(void *)copy._40_8_,0x30);
    bVar1 = ParseUnscopedTemplateName((State *)copy._40_8_);
    if ((bVar1) && (bVar1 = ParseTemplateArgs((State *)copy._40_8_), bVar1)) {
      state_local._7_1_ = true;
    }
    else {
      memcpy((void *)copy._40_8_,local_48,0x30);
      bVar1 = ParseUnscopedName((State *)copy._40_8_);
      if (bVar1) {
        state_local._7_1_ = true;
      }
      else {
        state_local._7_1_ = false;
      }
    }
  }
  return state_local._7_1_;
}

Assistant:

static bool ParseName(State *state) {
  if (ParseNestedName(state) || ParseLocalName(state)) {
    return true;
  }

  State copy = *state;
  if (ParseUnscopedTemplateName(state) &&
      ParseTemplateArgs(state)) {
    return true;
  }
  *state = copy;

  // Less greedy than <unscoped-template-name> <template-args>.
  if (ParseUnscopedName(state)) {
    return true;
  }
  return false;
}